

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O0

ostream * __thiscall dg::debug::LLVMDG2Dot::printKey(LLVMDG2Dot *this,ostream *os,Value *val)

{
  ostream *poVar1;
  Value *in_stack_00000230;
  ostream *in_stack_00000238;
  
  poVar1 = anon_unknown_6::printLLVMVal(in_stack_00000238,in_stack_00000230);
  return poVar1;
}

Assistant:

std::ostream &printKey(std::ostream &os, llvm::Value *val) override {
        return printLLVMVal(os, val);
    }